

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O3

void __thiscall clara::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  pointer *ppiVar1;
  Column *pCVar2;
  iterator __position;
  size_type __n;
  Column *col;
  Column *column;
  iterator local_58;
  
  this->m_columns = &columns->m_columns;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(columns->m_columns).
               super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(columns->m_columns).
               super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  this->m_activeIterators = __n;
  std::vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,__n);
  pCVar2 = (this->m_columns->
           super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (column = (this->m_columns->
                super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; column != pCVar2; column = column + 1) {
    Column::iterator::iterator(&local_58,column);
    __position._M_current =
         (this->m_iterators).
         super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_iterators).
        super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
      ::_M_realloc_insert<clara::TextFlow::Column::iterator>
                (&this->m_iterators,__position,&local_58);
    }
    else {
      (__position._M_current)->m_end = local_58.m_end;
      (__position._M_current)->m_suffix = local_58.m_suffix;
      *(undefined7 *)&(__position._M_current)->field_0x29 = local_58._41_7_;
      (__position._M_current)->m_pos = local_58.m_pos;
      (__position._M_current)->m_len = local_58.m_len;
      (__position._M_current)->m_column = local_58.m_column;
      (__position._M_current)->m_stringIndex = local_58.m_stringIndex;
      ppiVar1 = &(this->m_iterators).
                 super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + 1;
    }
  }
  return;
}

Assistant:

explicit iterator( Columns const& columns )
            :   m_columns( columns.m_columns ),
                m_activeIterators( m_columns.size() )
            {
                m_iterators.reserve( m_columns.size() );

                for( auto const& col : m_columns )
                    m_iterators.push_back( col.begin() );
            }